

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O2

void __thiscall OpenMD::COHZ::correlateFrames(COHZ *this,int frame1,int frame2,int timeBin)

{
  int *piVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  int *piVar6;
  vector<int,_std::allocator<int>_> s2;
  vector<int,_std::allocator<int>_> s1;
  Vector<double,_4U> corrVal;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  long local_88;
  long local_80;
  long local_78;
  Vector<double,_4U> local_70;
  Vector<double,_4U> local_50;
  
  local_a8._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.data_[0] = 0.0;
  Vector<double,_4U>::Vector(&local_50,local_70.data_);
  local_78 = (long)frame1 * 0x18;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&local_a8,
             (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
             super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
             super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.sele1ToIndex_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame1);
  pvVar2 = &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
            super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
            super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.sele1ToIndex_;
  if ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
      super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
      super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.uniqueSelections_ != false) {
    pvVar2 = &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
              super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
              super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.sele2ToIndex_;
  }
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&local_c8,
             (pvVar2->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + frame2);
  local_80 = (long)timeBin * 0x18;
  piVar4 = local_a8._M_impl.super__Vector_impl_data._M_start;
  for (piVar3 = local_c8._M_impl.super__Vector_impl_data._M_start;
      (piVar4 != local_a8._M_impl.super__Vector_impl_data._M_finish &&
      (piVar6 = piVar4, piVar3 != local_c8._M_impl.super__Vector_impl_data._M_finish));
      piVar3 = piVar3 + 1) {
    for (; (piVar6 != local_a8._M_impl.super__Vector_impl_data._M_finish && (*piVar6 < *piVar3));
        piVar6 = piVar6 + 1) {
      piVar4 = piVar4 + 1;
    }
    lVar5 = -(long)piVar3;
    while( true ) {
      if (piVar3 == local_c8._M_impl.super__Vector_impl_data._M_finish) goto LAB_0013c1cd;
      if (*piVar6 <= *piVar3) break;
      piVar3 = piVar3 + 1;
      lVar5 = lVar5 + -4;
    }
    if ((piVar6 == local_a8._M_impl.super__Vector_impl_data._M_finish) ||
       (piVar3 == local_c8._M_impl.super__Vector_impl_data._M_finish)) break;
    (*(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
      super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
      super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.super_DynamicProperty._vptr_DynamicProperty
      [0x13])(&local_70,this,(ulong)(uint)frame1,(ulong)(uint)frame2,
              (ulong)((long)piVar4 - (long)local_a8._M_impl.super__Vector_impl_data._M_start) >> 2,
              (ulong)-(lVar5 + (long)local_c8._M_impl.super__Vector_impl_data._M_start) >> 2);
    Vector<double,_4U>::operator=(&local_50,&local_70);
    lVar5 = local_80;
    local_88 = (long)*(int *)((*(long *)((long)&(((this->zbin_).
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_start + local_78)
                              - (long)local_a8._M_impl.super__Vector_impl_data._M_start) +
                             (long)piVar4);
    Vector<double,_4U>::add
              ((Vector<double,_4U> *)
               (local_88 * 0x20 +
               *(long *)((long)&(((this->histogram_).
                                  super__Vector_base<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + local_80)),&local_50);
    piVar1 = (int *)(*(long *)((long)&(((this->counts_).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                      super__Vector_impl_data._M_start + lVar5) + local_88 * 4);
    *piVar1 = *piVar1 + 1;
    piVar4 = piVar6 + 1;
  }
LAB_0013c1cd:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
  return;
}

Assistant:

void COHZ::correlateFrames(int frame1, int frame2, int timeBin) {
    std::vector<int> s1;
    std::vector<int> s2;

    std::vector<int>::iterator i1;
    std::vector<int>::iterator i2;

    Vector<RealType, 4> corrVal(0.0);

    s1 = sele1ToIndex_[frame1];

    if (uniqueSelections_)
      s2 = sele2ToIndex_[frame2];
    else
      s2 = sele1ToIndex_[frame2];

    for (i1 = s1.begin(), i2 = s2.begin(); i1 != s1.end() && i2 != s2.end();
         ++i1, ++i2) {
      // If the selections are dynamic, they might not have the
      // same objects in both frames, so we need to roll either of
      // the selections until we have the same object to
      // correlate.

      while (i1 != s1.end() && *i1 < *i2) {
        ++i1;
      }

      while (i2 != s2.end() && *i2 < *i1) {
        ++i2;
      }

      if (i1 == s1.end() || i2 == s2.end()) break;

      corrVal  = calcCorrVal(frame1, frame2, i1 - s1.begin(), i2 - s2.begin());
      int zBin = zbin_[frame1][i1 - s1.begin()];

      histogram_[timeBin][zBin] += corrVal;
      counts_[timeBin][zBin]++;
    }
  }